

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckStructure.cpp
# Opt level: O2

bool __thiscall CheckStructure::isMain(CheckStructure *this,string *nameMain)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  _Var1 = std::operator==(nameMain,&this->nMain);
  if (_Var1) {
    return true;
  }
  std::__cxx11::string::substr((ulong)&bStack_68,(ulong)nameMain);
  _Var1 = std::operator==(&bStack_68,
                          (this->delimiters).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 5);
  if (_Var1) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)nameMain);
    _Var1 = std::operator==(&local_48,&this->nMain);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&bStack_68);
    if (_Var1) {
      this->m_countCalls = this->m_countCalls + 2;
      std::__cxx11::string::substr((ulong)&bStack_68,(ulong)nameMain);
      _Var1 = std::operator==(&bStack_68,
                              (this->delimiters).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 2);
      std::__cxx11::string::~string((string *)&bStack_68);
      if (!_Var1) {
        return true;
      }
      this->m_countCalls = this->m_countCalls + 1;
      std::__cxx11::string::substr((ulong)&bStack_68,(ulong)nameMain);
      _Var1 = std::operator==(&bStack_68,&this->nReturn);
      std::__cxx11::string::~string((string *)&bStack_68);
      if (!_Var1) {
        return true;
      }
      goto LAB_00103356;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&bStack_68);
  }
  std::__cxx11::string::substr((ulong)&bStack_68,(ulong)nameMain);
  _Var1 = std::operator==(&bStack_68,
                          (this->delimiters).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::~string((string *)&bStack_68);
  if (!_Var1) {
    std::__cxx11::string::string
              ((string *)&bStack_68,"wrong name of main func",(allocator *)&local_48);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_errors,
               &bStack_68);
    std::__cxx11::string::~string((string *)&bStack_68);
    return false;
  }
LAB_00103356:
  this->m_countCalls = this->m_countCalls + 1;
  return true;
}

Assistant:

bool CheckStructure::isMain(string nameMain) {
    if (nameMain == nMain)
        return true;
    if ((nameMain.substr(4, 2) == delimiters[5]) && (nameMain.substr(0, 4) == nMain)) {
        m_countCalls += 2;
        if (nameMain.substr(6, 1) == delimiters[2]) {
            m_countCalls++;
            if (nameMain.substr(7, 6) == nReturn)
                m_countCalls++;
        }
        return true;
    }
    if (nameMain.substr(4, 1) == delimiters[0]) {
        m_countCalls++;
        return true;
    }
    m_errors.push_back("wrong name of main func");
    return false;
}